

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_feature(cram_container *c,cram_slice *s,cram_record *r,cram_feature *f)

{
  int iVar1;
  cram_feature *pcVar2;
  int local_34;
  cram_feature *f_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  
  if (s->afeatures <= s->nfeatures) {
    if (s->afeatures == 0) {
      local_34 = 0x400;
    }
    else {
      local_34 = s->afeatures << 1;
    }
    s->afeatures = local_34;
    pcVar2 = (cram_feature *)realloc(s->features,(long)s->afeatures << 4);
    s->features = pcVar2;
    if (s->features == (cram_feature *)0x0) {
      return -1;
    }
  }
  iVar1 = r->nfeature;
  r->nfeature = iVar1 + 1;
  if (iVar1 == 0) {
    r->feature = s->nfeatures;
    cram_stats_add(c->stats[0x1c],(f->field_0).X.pos);
  }
  else {
    cram_stats_add(c->stats[0x1c],
                   (f->field_0).X.pos - s->features[r->feature + r->nfeature + -2].field_0.X.pos);
  }
  cram_stats_add(c->stats[0x1b],(f->field_0).X.code);
  pcVar2 = s->features;
  iVar1 = s->nfeatures;
  s->nfeatures = iVar1 + 1;
  *(undefined8 *)&pcVar2[iVar1].field_0 = *(undefined8 *)&f->field_0;
  *(undefined8 *)((long)&pcVar2[iVar1].field_0 + 8) = *(undefined8 *)((long)&f->field_0 + 8);
  return 0;
}

Assistant:

static int cram_add_feature(cram_container *c, cram_slice *s,
			    cram_record *r, cram_feature *f) {
    if (s->nfeatures >= s->afeatures) {
	s->afeatures = s->afeatures ? s->afeatures*2 : 1024;
	s->features = realloc(s->features, s->afeatures*sizeof(*s->features));
	if (!s->features)
	    return -1;
    }

    if (!r->nfeature++) {
	r->feature = s->nfeatures;
	cram_stats_add(c->stats[DS_FP], f->X.pos);
    } else {
	cram_stats_add(c->stats[DS_FP],
		       f->X.pos - s->features[r->feature + r->nfeature-2].X.pos);
    }
    cram_stats_add(c->stats[DS_FC], f->X.code);

    s->features[s->nfeatures++] = *f;

    return 0;
}